

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void pager_release_kv_engine(Pager *pPager)

{
  unqlite_kv_engine *pChunk;
  unqlite *puVar1;
  unqlite_db *pStorage;
  unqlite_kv_engine *pEngine;
  Pager *pPager_local;
  
  pChunk = pPager->pEngine;
  puVar1 = pPager->pDb;
  if ((puVar1->sDB).pCursor != (unqlite_kv_cursor *)0x0) {
    unqliteReleaseCursor(pPager->pDb,(puVar1->sDB).pCursor);
    (puVar1->sDB).pCursor = (unqlite_kv_cursor *)0x0;
  }
  if (pChunk->pIo->pMethods->xRelease != (_func_void_unqlite_kv_engine_ptr *)0x0) {
    (*pChunk->pIo->pMethods->xRelease)(pChunk);
  }
  SyMemBackendFree(&pPager->pDb->sMem,pChunk->pIo);
  SyMemBackendFree(&pPager->pDb->sMem,pChunk);
  pPager->pEngine = (unqlite_kv_engine *)0x0;
  return;
}

Assistant:

static void pager_release_kv_engine(Pager *pPager)
{
	unqlite_kv_engine *pEngine = pPager->pEngine;
	unqlite_db *pStorage = &pPager->pDb->sDB;
	if( pStorage->pCursor ){
		/* Release the associated cursor */
		unqliteReleaseCursor(pPager->pDb,pStorage->pCursor);
		pStorage->pCursor = 0;
	}
	if( pEngine->pIo->pMethods->xRelease ){
		pEngine->pIo->pMethods->xRelease(pEngine);
	}
	/* Release the whole instance */
	SyMemBackendFree(&pPager->pDb->sMem,(void *)pEngine->pIo);
	SyMemBackendFree(&pPager->pDb->sMem,(void *)pEngine);
	pPager->pEngine = 0;
}